

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::TransferTest::createInstance(TransferTest *this,Context *context)

{
  Context *context_00;
  TransferTestInstance *this_00;
  vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_30;
  Context *local_18;
  Context *context_local;
  TransferTest *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (TransferTestInstance *)operator_new(0x200);
  context_00 = local_18;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&local_30,&(this->super_TimestampTest).m_stages);
  TransferTestInstance::TransferTestInstance
            (this_00,context_00,&local_30,(bool)((this->super_TimestampTest).m_inRenderPass & 1),
             *(TransferMethod *)&(this->super_TimestampTest).field_0x8c);
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::~vector
            (&local_30);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TransferTest::createInstance(Context& context) const
{
  return new TransferTestInstance(context, m_stages, m_inRenderPass, m_method);
}